

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O3

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralSymbolExpression *expression)

{
  ostream *poVar1;
  string *psVar2;
  char local_49;
  Token local_48;
  
  this->isExpression = true;
  local_48.kind._0_1_ = TK_U32;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x20,(char *)&local_48,1);
  LiteralExpression::get_token(&local_48,&expression->super_LiteralExpression);
  psVar2 = Token::getLexem_abi_cxx11_(&local_48);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
  local_49 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.lexem._M_dataplus._M_p != &local_48.lexem.field_2) {
    operator_delete(local_48.lexem._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CppPrinter::visit(LiteralSymbolExpression* expression) {
    isExpression = true;
    output << '"' << expression->get_token().getLexem() << '"';
}